

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

exr_result_t exr_print_context_info(exr_const_context_t ctxt,int verbose)

{
  _internal_exr_part *p_Var1;
  char *pcVar2;
  char *pcVar3;
  int in_ESI;
  _internal_exr_context *in_RDI;
  char *pcVar4;
  char *pcVar5;
  int l_1;
  int l;
  int a;
  _internal_exr_part *curpart;
  int partidx;
  _internal_exr_context *pctxt;
  int in_stack_0000005c;
  exr_attribute_t *in_stack_00000060;
  exr_attr_chlist_entry_t *local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_24;
  exr_result_t local_4;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_RDI);
    }
    if (in_ESI == 0) {
      printf("File \'%s\':\n",(in_RDI->filename).str);
    }
    else {
      pcVar3 = "";
      if (in_RDI->is_singlepart_tiled != '\0') {
        pcVar3 = " singletile";
      }
      pcVar4 = " shortnames";
      if (in_RDI->max_name_length == 0xff) {
        pcVar4 = " longnames";
      }
      pcVar5 = "";
      if (in_RDI->has_nonimage_data != '\0') {
        pcVar5 = " deep";
      }
      pcVar2 = "";
      if (in_RDI->is_multipart != '\0') {
        pcVar2 = " multipart";
      }
      printf("File \'%s\': ver %d flags%s%s%s%s\n",(in_RDI->filename).str,(ulong)in_RDI->version,
             pcVar3,pcVar4,pcVar5,pcVar2);
      printf(" parts: %d\n",(ulong)(uint)in_RDI->num_parts);
    }
    for (local_24 = 0; local_24 < in_RDI->num_parts; local_24 = local_24 + 1) {
      p_Var1 = in_RDI->parts[local_24];
      if (((in_ESI != 0) || (in_RDI->is_multipart != '\0')) ||
         (p_Var1->name != (exr_attribute_t *)0x0)) {
        if (p_Var1->name == (exr_attribute_t *)0x0) {
          local_48 = (exr_attr_chlist_entry_t *)0x33ec7b;
        }
        else {
          local_48 = ((p_Var1->name->field_6).chlist)->entries;
        }
        printf(" part %d: %s\n",(ulong)(local_24 + 1),local_48);
      }
      if (in_ESI == 0) {
        if (p_Var1->type != (exr_attribute_t *)0x0) {
          printf("  ");
          print_attr(in_stack_00000060,in_stack_0000005c);
        }
        printf("  ");
        print_attr(in_stack_00000060,in_stack_0000005c);
        if (p_Var1->tiles != (exr_attribute_t *)0x0) {
          printf("\n  ");
          print_attr(in_stack_00000060,in_stack_0000005c);
        }
        printf("\n  ");
        print_attr(in_stack_00000060,in_stack_0000005c);
        printf("\n  ");
        print_attr(in_stack_00000060,in_stack_0000005c);
        printf("\n  ");
        print_attr(in_stack_00000060,in_stack_0000005c);
        printf("\n");
      }
      else {
        for (local_34 = 0; local_34 < (p_Var1->attributes).num_attributes; local_34 = local_34 + 1)
        {
          if (0 < local_34) {
            printf("\n");
          }
          printf("  ");
          print_attr(in_stack_00000060,in_stack_0000005c);
        }
        printf("\n");
      }
      if (p_Var1->tiles != (exr_attribute_t *)0x0) {
        printf("  tiled image has levels: x %d y %d\n",(ulong)(uint)p_Var1->num_tile_levels_x,
               (ulong)(uint)p_Var1->num_tile_levels_y);
        printf("    x tile count:");
        for (local_38 = 0; local_38 < p_Var1->num_tile_levels_x; local_38 = local_38 + 1) {
          printf(" %d (sz %d)",(ulong)(uint)p_Var1->tile_level_tile_count_x[local_38],
                 (ulong)(uint)p_Var1->tile_level_tile_size_x[local_38]);
        }
        printf("\n    y tile count:");
        for (local_3c = 0; local_3c < p_Var1->num_tile_levels_y; local_3c = local_3c + 1) {
          printf(" %d (sz %d)",(ulong)(uint)p_Var1->tile_level_tile_count_y[local_3c],
                 (ulong)(uint)p_Var1->tile_level_tile_size_y[local_3c]);
        }
        printf("\n");
      }
    }
    if (in_RDI->mode == '\x01') {
      internal_exr_unlock(in_RDI);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_print_context_info (exr_const_context_t ctxt, int verbose)
{
    EXR_PROMOTE_CONST_CONTEXT_OR_ERROR (ctxt);
    if (verbose)
    {
        printf (
            "File '%s': ver %d flags%s%s%s%s\n",
            pctxt->filename.str,
            (int) pctxt->version,
            pctxt->is_singlepart_tiled ? " singletile" : "",
            pctxt->max_name_length == EXR_LONGNAME_MAXLEN ? " longnames"
                                                          : " shortnames",
            pctxt->has_nonimage_data ? " deep" : "",
            pctxt->is_multipart ? " multipart" : "");
        printf (" parts: %d\n", pctxt->num_parts);
    }
    else
    {
        printf ("File '%s':\n", pctxt->filename.str);
    }

    for (int partidx = 0; partidx < pctxt->num_parts; ++partidx)
    {
        const struct _internal_exr_part* curpart = pctxt->parts[partidx];
        if (verbose || pctxt->is_multipart || curpart->name)
            printf (
                " part %d: %s\n",
                partidx + 1,
                curpart->name ? curpart->name->string->str : "<single>");
        if (verbose)
        {
            for (int a = 0; a < curpart->attributes.num_attributes; ++a)
            {
                if (a > 0) printf ("\n");
                printf ("  ");
                print_attr (curpart->attributes.entries[a], verbose);
            }
            printf ("\n");
        }
        else
        {
            if (curpart->type)
            {
                printf ("  ");
                print_attr (curpart->type, verbose);
            }
            printf ("  ");
            print_attr (curpart->compression, verbose);
            if (curpart->tiles)
            {
                printf ("\n  ");
                print_attr (curpart->tiles, verbose);
            }
            printf ("\n  ");
            print_attr (curpart->displayWindow, verbose);
            printf ("\n  ");
            print_attr (curpart->dataWindow, verbose);
            printf ("\n  ");
            print_attr (curpart->channels, verbose);
            printf ("\n");
        }
        if (curpart->tiles)
        {
            printf (
                "  tiled image has levels: x %d y %d\n",
                curpart->num_tile_levels_x,
                curpart->num_tile_levels_y);
            printf ("    x tile count:");
            for (int l = 0; l < curpart->num_tile_levels_x; ++l)
                printf (
                    " %d (sz %d)",
                    curpart->tile_level_tile_count_x[l],
                    curpart->tile_level_tile_size_x[l]);
            printf ("\n    y tile count:");
            for (int l = 0; l < curpart->num_tile_levels_y; ++l)
                printf (
                    " %d (sz %d)",
                    curpart->tile_level_tile_count_y[l],
                    curpart->tile_level_tile_size_y[l]);
            printf ("\n");
        }
    }
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
}